

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O2

void Assimp::IFC::ProcessSweptAreaSolid
               (IfcSweptAreaSolid *swept,TempMesh *meshout,ConversionData *conv)

{
  IfcExtrudedAreaSolid *solid;
  IfcRevolvedAreaSolid *solid_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  format local_190;
  
  solid = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcExtrudedAreaSolid>
                    ((Object *)
                     ((long)&(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                             super_IfcRepresentationItem.
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                             ._vptr_ObjectHelper +
                     (long)(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                           super_IfcRepresentationItem.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           _vptr_ObjectHelper[-3]));
  if (solid != (IfcExtrudedAreaSolid *)0x0) {
    ProcessExtrudedAreaSolid
              (solid,meshout,conv,
               conv->collect_openings !=
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0);
    return;
  }
  solid_00 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcRevolvedAreaSolid>
                       ((Object *)
                        ((long)&(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper +
                        (long)(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper[-3]));
  if (solid_00 != (IfcRevolvedAreaSolid *)0x0) {
    ProcessRevolvedAreaSolid(solid_00,meshout,conv);
    return;
  }
  STEP::Object::GetClassName_abi_cxx11_
            (&local_1b0,
             (Object *)
             ((long)&(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                     super_IfcRepresentationItem.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                     _vptr_ObjectHelper +
             (long)(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                   super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper[-3]));
  std::operator+(&local_1d0,"skipping unknown IfcSweptAreaSolid entity, type is ",&local_1b0);
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
  basic_formatter<std::__cxx11::string>
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_190,
             &local_1d0);
  LogFunctions<Assimp::IFCImporter>::LogWarn(&local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  return;
}

Assistant:

void ProcessSweptAreaSolid(const Schema_2x3::IfcSweptAreaSolid& swept, TempMesh& meshout,
    ConversionData& conv)
{
    if(const Schema_2x3::IfcExtrudedAreaSolid* const solid = swept.ToPtr<Schema_2x3::IfcExtrudedAreaSolid>()) {
        ProcessExtrudedAreaSolid(*solid,meshout,conv, !!conv.collect_openings);
    }
    else if(const Schema_2x3::IfcRevolvedAreaSolid* const rev = swept.ToPtr<Schema_2x3::IfcRevolvedAreaSolid>()) {
        ProcessRevolvedAreaSolid(*rev,meshout,conv);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcSweptAreaSolid entity, type is " + swept.GetClassName());
    }
}